

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O3

void EV_StartLightStrobing(int tag,int utics,int ltics)

{
  sector_t_conflict *sector;
  DSectorEffect *pDVar1;
  uint uVar2;
  DStrobe *this;
  FSectorTagIterator it;
  FSectorTagIterator local_38;
  
  if (tag == 0) {
    local_38.start = 0;
  }
  else {
    local_38.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  local_38.searchtag = tag;
  uVar2 = FSectorTagIterator::Next(&local_38);
  do {
    if ((int)uVar2 < 0) {
      return;
    }
    sector = sectors + uVar2;
    pDVar1 = sectors[uVar2].lightingdata.field_0.p;
    if (pDVar1 == (DSectorEffect *)0x0) {
LAB_00401d95:
      this = (DStrobe *)
             M_Malloc_Dbg(0x58,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                          ,0x1f9);
      DStrobe::DStrobe(this,(sector_t *)sector,utics,ltics,false);
    }
    else if (((pDVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (sector->lightingdata).field_0.p = (DSectorEffect *)0x0;
      goto LAB_00401d95;
    }
    uVar2 = FSectorTagIterator::Next(&local_38);
  } while( true );
}

Assistant:

void EV_StartLightStrobing (int tag, int utics, int ltics)
{
	int secnum;
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *sec = &sectors[secnum];
		if (sec->lightingdata)
			continue;
		
		new DStrobe (sec, utics, ltics, false);
	}
}